

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_retr(Curl_easy *data,curl_off_t filesize)

{
  FTP *pFVar1;
  connectdata *pcVar2;
  anon_union_280_8_fcbf97e8_for_proto *pp;
  char *local_50;
  ftp_conn *ftpc;
  connectdata *conn;
  FTP *ftp;
  CURLcode result;
  curl_off_t filesize_local;
  Curl_easy *data_local;
  
  pFVar1 = (data->req).p.ftp;
  pcVar2 = data->conn;
  pp = &pcVar2->proto;
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     (0 < Curl_trc_feat_ftp.log_level)) {
    if ((data == (Curl_easy *)0x0) || (data->conn == (connectdata *)0x0)) {
      local_50 = "???";
    }
    else {
      local_50 = ftp_state_names[(data->conn->proto).ftpc.state];
    }
    Curl_trc_ftp(data,"[%s] ftp_state_retr()",local_50);
  }
  if (((data->set).max_filesize != 0) && ((data->set).max_filesize < filesize)) {
    Curl_failf(data,"Maximum file size exceeded");
    return CURLE_FILESIZE_EXCEEDED;
  }
  pFVar1->downloadsize = filesize;
  if ((data->state).resume_from == 0) {
    ftp._4_4_ = Curl_pp_sendf(data,&(pp->ftpc).pp,"RETR %s",(pcVar2->proto).ftpc.file);
    if (ftp._4_4_ == CURLE_OK) {
      _ftp_state(data,' ');
    }
  }
  else {
    if (filesize == -1) {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"ftp server does not support SIZE");
      }
    }
    else if ((data->state).resume_from < 0) {
      if (filesize < -(data->state).resume_from) {
        Curl_failf(data,"Offset (%ld) was beyond file size (%ld)",(data->state).resume_from,filesize
                  );
        return CURLE_BAD_DOWNLOAD_RESUME;
      }
      pFVar1->downloadsize = -(data->state).resume_from;
      (data->state).resume_from = filesize - pFVar1->downloadsize;
    }
    else {
      if (filesize < (data->state).resume_from) {
        Curl_failf(data,"Offset (%ld) was beyond file size (%ld)",(data->state).resume_from,filesize
                  );
        return CURLE_BAD_DOWNLOAD_RESUME;
      }
      pFVar1->downloadsize = filesize - (data->state).resume_from;
    }
    if (pFVar1->downloadsize == 0) {
      Curl_xfer_setup_nop(data);
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"File already completely downloaded");
      }
      pFVar1->transfer = PPTRANSFER_NONE;
      _ftp_state(data,'\0');
      return CURLE_OK;
    }
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data,"Instructs server to resume from offset %ld",(data->state).resume_from);
    }
    ftp._4_4_ = Curl_pp_sendf(data,&(pp->ftpc).pp,"REST %ld",(data->state).resume_from);
    if (ftp._4_4_ == CURLE_OK) {
      _ftp_state(data,'\x1b');
    }
  }
  return ftp._4_4_;
}

Assistant:

static CURLcode ftp_state_retr(struct Curl_easy *data,
                               curl_off_t filesize)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  CURL_TRC_FTP(data, "[%s] ftp_state_retr()", FTP_DSTATE(data));
  if(data->set.max_filesize && (filesize > data->set.max_filesize)) {
    failf(data, "Maximum file size exceeded");
    return CURLE_FILESIZE_EXCEEDED;
  }
  ftp->downloadsize = filesize;

  if(data->state.resume_from) {
    /* We always (attempt to) get the size of downloads, so it is done before
       this even when not doing resumes. */
    if(filesize == -1) {
      infof(data, "ftp server does not support SIZE");
      /* We could not get the size and therefore we cannot know if there really
         is a part of the file left to get, although the server will just
         close the connection when we start the connection so it will not cause
         us any harm, just not make us exit as nicely. */
    }
    else {
      /* We got a file size report, so we check that there actually is a
         part of the file left to get, or else we go home.  */
      if(data->state.resume_from < 0) {
        /* We are supposed to download the last abs(from) bytes */
        if(filesize < -data->state.resume_from) {
          failf(data, "Offset (%" FMT_OFF_T
                ") was beyond file size (%" FMT_OFF_T ")",
                data->state.resume_from, filesize);
          return CURLE_BAD_DOWNLOAD_RESUME;
        }
        /* convert to size to download */
        ftp->downloadsize = -data->state.resume_from;
        /* download from where? */
        data->state.resume_from = filesize - ftp->downloadsize;
      }
      else {
        if(filesize < data->state.resume_from) {
          failf(data, "Offset (%" FMT_OFF_T
                ") was beyond file size (%" FMT_OFF_T ")",
                data->state.resume_from, filesize);
          return CURLE_BAD_DOWNLOAD_RESUME;
        }
        /* Now store the number of bytes we are expected to download */
        ftp->downloadsize = filesize-data->state.resume_from;
      }
    }

    if(ftp->downloadsize == 0) {
      /* no data to transfer */
      Curl_xfer_setup_nop(data);
      infof(data, "File already completely downloaded");

      /* Set ->transfer so that we will not get any error in ftp_done()
       * because we did not transfer the any file */
      ftp->transfer = PPTRANSFER_NONE;
      ftp_state(data, FTP_STOP);
      return CURLE_OK;
    }

    /* Set resume file transfer offset */
    infof(data, "Instructs server to resume from offset %" FMT_OFF_T,
          data->state.resume_from);

    result = Curl_pp_sendf(data, &ftpc->pp, "REST %" FMT_OFF_T,
                           data->state.resume_from);
    if(!result)
      ftp_state(data, FTP_RETR_REST);
  }
  else {
    /* no resume */
    result = Curl_pp_sendf(data, &ftpc->pp, "RETR %s", ftpc->file);
    if(!result)
      ftp_state(data, FTP_RETR);
  }

  return result;
}